

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.cpp
# Opt level: O2

void __thiscall
ser::FileFormat::Init
          (FileFormat *this,string *directory,string *prefix,MetainfoSet *globalMetainfo,
          FieldsTable *fieldsTable,OffsetTable *offsetTable)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (directory->_M_dataplus)._M_p + (int)directory->_M_string_length;
  do {
    pcVar1 = pcVar1 + -1;
  } while (*pcVar1 == '/');
  std::__cxx11::string::substr((ulong)&local_70,(ulong)directory);
  std::operator+(&local_50,&local_70,'/');
  std::__cxx11::string::operator=((string *)&this->directory_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::_M_assign((string *)&this->prefix_);
  this->pGlobalMetainfo_ = globalMetainfo;
  this->pFieldsTable_ = fieldsTable;
  this->pOffsetTable_ = offsetTable;
  return;
}

Assistant:

void FileFormat::Init (const std::string& directory, const std::string& prefix,
                       MetainfoSet& globalMetainfo, FieldsTable& fieldsTable, OffsetTable& offsetTable)
{
    // Remove trailing /
    int size = directory.size();
    while (directory[size-1] == '/')
        --size;

    directory_ = directory.substr(0, size) + '/';
    prefix_ = prefix;
    pGlobalMetainfo_ = &globalMetainfo;
    pFieldsTable_ = &fieldsTable;
    pOffsetTable_ = &offsetTable;
}